

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::FMdivideMOD(Forth *this)

{
  uint uVar1;
  uint valueHi;
  anon_union_8_2_340ac67b_for_data_ local_68;
  SDCell reminder;
  SDCell quotent;
  allocator<char> local_41;
  string local_40;
  anon_union_8_2_340ac67b_for_data_ local_20;
  SDCell d1;
  SDCell n1;
  Forth *this_local;
  
  requireDStackDepth(this,3,"FM/MOD");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  SDCell::SDCell(&d1,(long)(int)uVar1);
  ForthStack<unsigned_int>::pop(&this->dStack);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  valueHi = ForthStack<unsigned_int>::getTop(&this->dStack);
  SDCell::SDCell((SDCell *)&local_20.Cells,uVar1,valueHi);
  if (d1.data_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"FM/MOD: zero divisor",&local_41);
    throwCppExceptionMessage(this,&local_40,errorDivisionByZero);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  SDCell::SDCell(&reminder,local_20.Dcells / (long)d1.data_);
  SDCell::SDCell((SDCell *)&local_68.Cells,local_20.Dcells % (long)d1.data_);
  if (((0 < local_68.Dcells) && ((long)d1.data_ < 0)) ||
     ((local_68.Dcells < 0 && (0 < (long)d1.data_)))) {
    local_68 = d1.data_ + local_68.Dcells;
    reminder.data_ = (anon_union_8_2_340ac67b_for_data_)((long)reminder.data_ + -1);
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,0,reminder.data_.Cells.lo);
  ForthStack<unsigned_int>::setTop(&this->dStack,1,local_68.Cells.lo);
  return;
}

Assistant:

void FMdivideMOD(){
			REQUIRE_DSTACK_DEPTH(3, "FM/MOD");
			SDCell n1{ static_cast<SCell>(dStack.getTop()) }; dStack.pop();
			SDCell d1(dStack.getTop(1),dStack.getTop());
			RUNTIME_ERROR_IF(n1.data_.Dcells == 0, "FM/MOD: zero divisor", errorDivisionByZero);
			SDCell quotent{ d1.data_.Dcells / n1.data_.Dcells }; // n3
			SDCell reminder{ d1.data_.Dcells % n1.data_.Dcells }; // n2
			if (((reminder.data_.Dcells > 0) && (n1.data_.Dcells < 0)) || 
				((reminder.data_.Dcells < 0) && (n1.data_.Dcells > 0))){
				reminder.data_.Dcells += n1.data_.Dcells;
				quotent.data_.Dcells--;
			}
			dStack.setTop(0, quotent.data_.Cells.lo);
			dStack.setTop(1, reminder.data_.Cells.lo);
		}